

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLRefInfo.cpp
# Opt level: O1

XProtoType * __thiscall xercesc_4_0::XMLRefInfo::getProtoType(XMLRefInfo *this)

{
  return (XProtoType *)classXMLRefInfo;
}

Assistant:

void XMLRefInfo::serialize(XSerializeEngine& serEng)
{
    if (serEng.isStoring())
    {   
        serEng<<fDeclared;
        serEng<<fUsed;
        serEng.writeString(fRefName);
    }
    else
    {
        serEng>>fDeclared;
        serEng>>fUsed;
        serEng.readString(fRefName);
    }

}